

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gss.c
# Opt level: O2

void ssh_gss_cleanup(ssh_gss_liblist *list)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < list->nlibraries; lVar2 = lVar2 + 1) {
    dlclose(*(undefined8 *)((long)&list->libraries->handle + lVar1));
    if (*(int *)((long)&list->libraries->id + lVar1) == 3) {
      safefree(*(void **)((long)&list->libraries->gsslogmsg + lVar1));
    }
    lVar1 = lVar1 + 200;
  }
  safefree(list->libraries);
  safefree(list);
  return;
}

Assistant:

void ssh_gss_cleanup(struct ssh_gss_liblist *list)
{
    int i;

    /*
     * dlopen and dlclose are defined to employ reference counting
     * in the case where the same library is repeatedly dlopened, so
     * even in a multiple-sessions-per-process context it's safe to
     * naively dlclose everything here without worrying about
     * destroying it under the feet of another SSH instance still
     * using it.
     */
    for (i = 0; i < list->nlibraries; i++) {
        dlclose(list->libraries[i].handle);
        if (list->libraries[i].id == 3) {
            /* The 'custom' id involves a dynamically allocated message.
             * Note that we must cast away the 'const' to free it. */
            sfree((char *)list->libraries[i].gsslogmsg);
        }
    }
    sfree(list->libraries);
    sfree(list);
}